

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.cpp
# Opt level: O2

ExpressionResult __thiscall
KV::ExpressionEngine::evaluateExpression
          (ExpressionEngine *this,string_view *expression,size_t offset)

{
  ParseException *this_00;
  ExpressionResult EVar1;
  LineColumn_t lineColumn;
  allocator<char> local_91;
  size_t offset_local;
  anon_class_48_6_102092b0 evaluate;
  array<char,_7UL> unsupportedOps;
  anon_class_8_1_3273dc56 peekChar;
  string local_48;
  array<char,_11UL> controls;
  
  evaluate.offset = &offset_local;
  evaluate.controls = &controls;
  builtin_strncpy(controls._M_elems,"$&|!()[]\n \t",0xb);
  evaluate.unsupportedOps = &unsupportedOps;
  builtin_strncpy(unsupportedOps._M_elems,"><=+-*/",7);
  evaluate.peekChar = &peekChar;
  offset_local = offset;
  evaluate.expression = expression;
  evaluate.this = this;
  peekChar.expression = expression;
  if (expression->_M_str[offset] == '[') {
    EVar1 = const::$_1::operator()((__1 *)&evaluate,offset + 1,']',&evaluate);
    return EVar1;
  }
  this_00 = (ParseException *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Invalid expression",&local_91);
  lineColumn = ResolveLineColumn(expression,offset_local);
  ParseException::ParseException(this_00,&local_48,lineColumn);
  __cxa_throw(this_00,&ParseException::typeinfo,ParseException::~ParseException);
}

Assistant:

ExpressionEngine::ExpressionResult ExpressionEngine::evaluateExpression( const std::string_view &expression, const size_t offset /*= 0*/ ) const
	{
		constexpr const std::array< char, 11 > controls = { '$', '&', '|', '!', '(', ')', '[', ']', '\n', ' ', '\t' };
		constexpr const std::array< char, 7 > unsupportedOps = { '>', '<', '=', '+', '-', '*', '/' };

		enum class LogicOp
		{
			NONE,
			OR,
			AND,
			UNSET // Special case for error handling when parsing
		};

		auto peekChar = [ &expression ]( const size_t index ) -> char
		{
			return ( index < expression.size() ) ? expression[ index ] : '\0';
		};

		auto evaluate = [ & ]( const size_t start, const char expressionEnd, auto &evaluateRecursive ) -> ExpressionResult
		{
			LogicOp currentOp = LogicOp::NONE;
			std::optional< bool > evaluation;

			bool isNot = false;

			for ( size_t i = start; i < expression.size(); ++i )
			{
				if ( expression[ i ] == '\n' )
				{
					const std::string errMsg = std::string( "Expected '" ) + expressionEnd + std::string( "', got EOL instead" );
					throw ParseException( errMsg, ResolveLineColumn( expression, i ) );
				}
				else if ( expression[ i ] == expressionEnd )
				{
					if ( !evaluation.has_value() )
						throw ParseException( "Expected an expression", ResolveLineColumn( expression, i ) );
					else if ( currentOp != LogicOp::NONE && currentOp != LogicOp::UNSET )
					{
						const std::string errMsg = std::string( "Expected primary-expression before '" ) + expressionEnd + std::string( "' token" );
						throw ParseException( errMsg, ResolveLineColumn( expression, i ) );
					}
					else
						return { evaluation.value(), i };
				}
				else if ( expression[ i ] == '!' )
				{
					isNot = !isNot;
					continue;
				}
				else if ( expression[ i ] == '(' )
				{
					ExpressionResult nextEvaluation = evaluateRecursive( i + 1, ')', evaluateRecursive );

					if ( isNot )
					{
						nextEvaluation.result = !nextEvaluation.result;
						isNot = false;
					}

					switch ( currentOp )
					{
						case LogicOp::NONE:
						{
							evaluation = nextEvaluation.result;
							break;
						}
						case LogicOp::OR:
						{
							evaluation = ( evaluation.value() || nextEvaluation.result );
							break;
						}
						case LogicOp::AND:
						{
							evaluation = ( evaluation.value() && nextEvaluation.result );
							break;
						}
						case LogicOp::UNSET:
						{
							throw ParseException( "Expected logical operator, expression incomplete", ResolveLineColumn( expression, i ) );
							break;
						}
					}

					currentOp = LogicOp::UNSET;
					i = nextEvaluation.end;

					continue;
				}
				else if ( expression[ i ] == '$' )
				{
					size_t len = 0;

					for ( size_t j = i + 1; j < expression.size(); ++j )
					{
						if ( std::find( controls.begin(), controls.end(), expression[ j ] ) != controls.end() )
							break;

						++len;
					}

					if ( len == 0 )
						throw ParseException( "Expected symbol", ResolveLineColumn( expression, i ) );
					else
					{
						const std::string name = std::string( expression, i + 1, len );
						const bool condition = ( isNot ) ? !getCondition( name ) : getCondition( name );

						isNot = false;

						switch ( currentOp )
						{
							case LogicOp::NONE:
							{
								evaluation = condition;
								break;
							}
							case LogicOp::OR:
							{
								evaluation = ( evaluation.value() || condition );
								break;
							}
							case LogicOp::AND:
							{
								evaluation = ( evaluation.value() && condition );
								break;
							}
							case LogicOp::UNSET:
							{
								throw ParseException( "Expected logical operator, expression incomplete", ResolveLineColumn( expression, i ) );
								break;
							}
						}

						currentOp = LogicOp::UNSET;
						i += len;
						continue;
					}

				}
				else if ( expression[ i ] == '&' )
				{
					if ( peekChar( i + 1 ) != '&' )
					{
						throw ParseException( "Bitwise operators not supported", ResolveLineColumn( expression, i ) );
					}
					else
					{
						currentOp = LogicOp::AND;
						++i;
						continue;
					}
				}
				else if ( expression[ i ] == '|' )
				{
					if ( peekChar( i + 1 ) != '|' )
					{
						throw ParseException( "Bitwise operators not supported", ResolveLineColumn( expression, i ) );
					}
					else
					{
						currentOp = LogicOp::OR;
						++i;
						continue;
					}
				}
				else if ( auto it = std::find( unsupportedOps.cbegin(), unsupportedOps.cend(), expression[ i ] ); it != unsupportedOps.cend() )
				{
					const std::string errMsg = std::string( "Unsupported operator '" ) + *it + std::string( "'" ) ;
					throw ParseException( errMsg, ResolveLineColumn( expression, i ) );
				}
			}

			throw ParseException( "Expected end of expression", ResolveLineColumn( expression, offset ) );
		};

		if ( expression[ offset ] != '[' )
			throw ParseException( "Invalid expression", ResolveLineColumn( expression, offset ) );

		return evaluate( offset + 1, ']', evaluate );
	}